

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int BrotliEncoderCompressStream
              (BrotliEncoderState *s,BrotliEncoderOperation op,size_t *available_in,
              uint8_t **next_in,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  anon_union_16_2_c961180f_for_tiny_buf_ *__dest;
  MemoryManager *pMVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  BrotliEncoderStreamState BVar5;
  size_t out_bytes;
  ulong uVar6;
  ulong uVar7;
  uint32_t *puVar8;
  uint8_t *puVar9;
  uint8_t *__dest_00;
  long lVar10;
  uint8_t *puVar11;
  int *table;
  size_t sVar12;
  byte bVar13;
  bool bVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint uVar23;
  uint uVar24;
  bool bVar25;
  uint32_t *local_a8;
  uint32_t *local_90;
  uint8_t *local_88;
  uint8_t *local_80;
  size_t storage_ix;
  uint8_t *local_68;
  uint local_60;
  BrotliEncoderStreamState local_5c;
  uint8_t *local_58;
  size_t *local_50;
  uint16_t *local_48;
  uint8_t *local_40;
  size_t local_38;
  byte bVar14;
  
  if (s->is_initialized_ == 0) {
    s->last_bytes_ = 0;
    s->last_bytes_bits_ = '\0';
    s->flint_ = -2;
    s->remaining_metadata_bytes_ = 0xffffffff;
    iVar4 = (s->params).quality;
    iVar16 = 0;
    if (0 < iVar4) {
      iVar16 = iVar4;
    }
    iVar17 = 0xb;
    if (iVar16 < 0xb) {
      iVar17 = iVar16;
    }
    (s->params).quality = iVar17;
    if (iVar4 < 3) {
      (s->params).large_window = 0;
    }
    iVar16 = (s->params).lgwin;
    iVar17 = 10;
    if (iVar16 < 10) {
LAB_00106669:
      (s->params).lgwin = iVar17;
    }
    else {
      iVar17 = 0x1e;
      if ((s->params).large_window == 0) {
        iVar17 = 0x18;
      }
      if (iVar17 < iVar16) goto LAB_00106669;
    }
    if (iVar4 < 2) {
      iVar16 = (s->params).lgwin;
    }
    else {
      iVar16 = 0xe;
      if (3 < iVar4) {
        iVar16 = (s->params).lgblock;
        if (iVar16 == 0) {
          iVar16 = 0x10;
          if (((8 < iVar4) && (iVar4 = (s->params).lgwin, 0x10 < iVar4)) &&
             (iVar16 = 0x12, iVar4 < 0x12)) {
            iVar16 = iVar4;
          }
        }
        else {
          iVar4 = 0x10;
          if (0x10 < iVar16) {
            iVar4 = iVar16;
          }
          iVar16 = 0x18;
          if (iVar4 < 0x18) {
            iVar16 = iVar4;
          }
        }
      }
    }
    (s->params).lgblock = iVar16;
    ChooseDistanceParams(&s->params);
    uVar7 = (s->params).stream_offset;
    if (uVar7 != 0) {
      s->flint_ = '\x02';
      s->dist_cache_[0] = -0x10;
      s->dist_cache_[1] = -0x10;
      s->dist_cache_[2] = -0x10;
      s->dist_cache_[3] = -0x10;
      uVar2 = *(undefined8 *)(s->dist_cache_ + 2);
      *(undefined8 *)s->saved_dist_cache_ = *(undefined8 *)s->dist_cache_;
      *(undefined8 *)(s->saved_dist_cache_ + 2) = uVar2;
    }
    uVar23 = (s->params).lgwin;
    iVar4 = (s->params).lgblock;
    bVar13 = (byte)iVar4;
    bVar14 = bVar13;
    if (iVar4 < (int)uVar23) {
      bVar14 = (byte)uVar23;
    }
    uVar21 = 1 << (bVar14 + 1 & 0x1f);
    uVar19 = (s->params).quality;
    uVar22 = 1 << (bVar13 & 0x1f);
    uVar24 = 0x12;
    if (0x12 < (int)uVar23) {
      uVar24 = uVar23;
    }
    if (1 < uVar19) {
      uVar24 = uVar23;
    }
    (s->ringbuffer_).size_ = uVar21;
    (s->ringbuffer_).mask_ = uVar21 - 1;
    (s->ringbuffer_).tail_size_ = uVar22;
    (s->ringbuffer_).total_size_ = uVar21 + uVar22;
    if (uVar7 == 0) {
      if ((s->params).large_window == 0) {
        if (uVar24 == 0x11) {
          s->last_bytes_ = 1;
LAB_001067d7:
          s->last_bytes_bits_ = '\a';
        }
        else if (uVar24 == 0x10) {
          s->last_bytes_ = 0;
          s->last_bytes_bits_ = '\x01';
        }
        else {
          if ((int)uVar24 < 0x12) {
            s->last_bytes_ = (short)(uVar24 << 4) - 0x7f;
            goto LAB_001067d7;
          }
          s->last_bytes_ = (short)uVar24 * 2 - 0x21;
          s->last_bytes_bits_ = '\x04';
        }
      }
      else {
        s->last_bytes_ = (ushort)((uVar24 & 0x3f) << 8) | 0x11;
        s->last_bytes_bits_ = '\x0e';
      }
    }
    else {
      uVar6 = (1L << ((byte)uVar24 & 0x3f)) - 0x10;
      if (uVar7 < uVar6) {
        uVar6 = uVar7;
      }
      (s->params).stream_offset = uVar6;
    }
    if (uVar19 == 0) {
      memcpy(s->cmd_depths_,InitCommandPrefixCodes_kDefaultCommandDepths,0x80);
      memcpy(s->cmd_bits_,InitCommandPrefixCodes_kDefaultCommandBits,0x100);
      s->cmd_code_[0] = 0xff;
      s->cmd_code_[1] = 'w';
      s->cmd_code_[2] = 0xd5;
      s->cmd_code_[3] = 0xbf;
      s->cmd_code_[4] = 0xe7;
      s->cmd_code_[5] = 0xde;
      s->cmd_code_[6] = 0xea;
      s->cmd_code_[7] = 0x9e;
      s->cmd_code_[8] = 'Q';
      s->cmd_code_[9] = ']';
      s->cmd_code_[10] = 0xde;
      s->cmd_code_[0xb] = 0xc6;
      s->cmd_code_[0xc] = 'p';
      s->cmd_code_[0xd] = 'W';
      s->cmd_code_[0xe] = 0xbc;
      s->cmd_code_[0xf] = 'X';
      s->cmd_code_[0x10] = 'X';
      s->cmd_code_[0x11] = 'X';
      s->cmd_code_[0x12] = 0xd8;
      s->cmd_code_[0x13] = 0xd8;
      s->cmd_code_[0x14] = 'X';
      s->cmd_code_[0x15] = 0xd5;
      s->cmd_code_[0x16] = 0xcb;
      s->cmd_code_[0x17] = 0x8c;
      s->cmd_code_[0x18] = 0xea;
      s->cmd_code_[0x19] = 0xe0;
      s->cmd_code_[0x1a] = 0xc3;
      s->cmd_code_[0x1b] = 0x87;
      s->cmd_code_[0x1c] = '\x1f';
      s->cmd_code_[0x1d] = 0x83;
      s->cmd_code_[0x1e] = 0xc1;
      s->cmd_code_[0x1f] = '`';
      s->cmd_code_[0x20] = '\x1c';
      s->cmd_code_[0x21] = 'g';
      s->cmd_code_[0x22] = 0xb2;
      s->cmd_code_[0x23] = 0xaa;
      s->cmd_code_[0x24] = '\x06';
      s->cmd_code_[0x25] = 0x83;
      s->cmd_code_[0x26] = 0xc1;
      s->cmd_code_[0x27] = '`';
      s->cmd_code_[0x28] = '0';
      s->cmd_code_[0x29] = '\x18';
      s->cmd_code_[0x2a] = 0xcc;
      s->cmd_code_[0x2b] = 0xa1;
      s->cmd_code_[0x2c] = 0xce;
      s->cmd_code_[0x2d] = 0x88;
      s->cmd_code_[0x2e] = 'T';
      s->cmd_code_[0x2f] = 0x94;
      s->cmd_code_[0x29] = '\x18';
      s->cmd_code_[0x2a] = 0xcc;
      s->cmd_code_[0x2b] = 0xa1;
      s->cmd_code_[0x2c] = 0xce;
      s->cmd_code_[0x2d] = 0x88;
      s->cmd_code_[0x2e] = 'T';
      s->cmd_code_[0x2f] = 0x94;
      s->cmd_code_[0x30] = 'F';
      s->cmd_code_[0x31] = 0xe1;
      s->cmd_code_[0x32] = 0xb0;
      s->cmd_code_[0x33] = 0xd0;
      s->cmd_code_[0x34] = 'N';
      s->cmd_code_[0x35] = 0xb2;
      s->cmd_code_[0x36] = 0xf7;
      s->cmd_code_[0x37] = '\x04';
      s->cmd_code_[0x38] = '\0';
      s->cmd_code_numbits_ = 0x1c0;
    }
    s->is_initialized_ = 1;
  }
  if ((ulong)s->remaining_metadata_bytes_ != 0xffffffff) {
    if (op != BROTLI_OPERATION_EMIT_METADATA) {
      return 0;
    }
    if (*available_in != (ulong)s->remaining_metadata_bytes_) {
      return 0;
    }
LAB_001068a5:
    if ((s->params).size_hint == 0) {
      uVar7 = s->input_pos_ - s->last_processed_pos_;
      if (0x3fffffff < uVar7) {
        uVar7 = 0x40000000;
      }
      (s->params).size_hint = uVar7;
    }
    if (*available_in < 0x1000001) {
      if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
        s->remaining_metadata_bytes_ = (uint32_t)*available_in;
        s->stream_state_ = BROTLI_STREAM_METADATA_HEAD;
      }
      if (s->stream_state_ - BROTLI_STREAM_METADATA_HEAD < 2) {
        __dest = &s->tiny_buf_;
        do {
          while( true ) {
            do {
              iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
            } while (iVar4 != 0);
            if (s->available_out_ != 0) {
              return 1;
            }
            if (s->input_pos_ != s->last_flush_pos_) break;
            if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) {
              s->next_out_ = (uint8_t *)__dest;
              uVar23 = s->remaining_metadata_bytes_;
              bVar14 = s->last_bytes_bits_;
              uVar18 = (ulong)bVar14;
              *(uint16_t *)&s->tiny_buf_ = s->last_bytes_;
              s->last_bytes_ = 0;
              s->last_bytes_bits_ = '\0';
              *(ulong *)((long)&s->tiny_buf_ + (ulong)(bVar14 >> 3)) =
                   (ulong)(s->tiny_buf_).u8[bVar14 >> 3];
              uVar6 = uVar18 + 1 >> 3;
              uVar20 = (ulong)(bVar14 + 3 >> 3);
              uVar7 = uVar18 + 4;
              *(ulong *)((long)&s->tiny_buf_ + uVar6) =
                   3L << ((byte)(uVar18 + 1) & 7) | (ulong)(s->tiny_buf_).u8[uVar6];
              *(ulong *)((long)&s->tiny_buf_ + uVar20) = (ulong)(s->tiny_buf_).u8[uVar20];
              if ((ulong)uVar23 == 1) {
                uVar19 = 0;
LAB_00106b20:
                uVar6 = uVar18 + (ulong)uVar19 * 8;
                *(ulong *)((long)__dest + (uVar7 >> 3)) =
                     (ulong)uVar19 << ((byte)uVar7 & 7) | (ulong)__dest->u8[uVar7 >> 3];
                uVar7 = uVar18 + 6 >> 3;
                *(ulong *)((long)__dest + uVar7) =
                     (ulong)uVar23 - 1 << ((byte)(uVar18 + 6) & 7) | (ulong)__dest->u8[uVar7];
              }
              else {
                if (uVar23 != 0) {
                  uVar19 = 0x1f;
                  if (uVar23 - 1 != 0) {
                    for (; uVar23 - 1 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                    }
                  }
                  uVar19 = (uVar19 ^ 0xffffffe0) + 0x28 >> 3;
                  goto LAB_00106b20;
                }
                *(ulong *)((long)__dest + (uVar7 >> 3)) = (ulong)__dest->u8[uVar7 >> 3];
                uVar6 = uVar18;
              }
              s->available_out_ = uVar6 + 0xd >> 3;
              s->stream_state_ = BROTLI_STREAM_METADATA_BODY;
            }
            else {
              uVar23 = s->remaining_metadata_bytes_;
              uVar7 = (ulong)uVar23;
              if (uVar7 == 0) {
                s->remaining_metadata_bytes_ = 0xffffffff;
                s->stream_state_ = BROTLI_STREAM_PROCESSING;
                return 1;
              }
              uVar6 = *available_out;
              if (uVar6 == 0) {
                if (0xf < uVar23) {
                  uVar23 = 0x10;
                }
                uVar7 = (ulong)uVar23;
                s->next_out_ = (uint8_t *)__dest;
                memcpy(__dest,*next_in,uVar7);
                *next_in = *next_in + uVar7;
                *available_in = *available_in - uVar7;
                s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - uVar23;
                s->available_out_ = uVar7;
              }
              else {
                if (uVar7 < uVar6) {
                  uVar6 = uVar7;
                }
                memcpy(*next_out,*next_in,uVar6);
                *next_in = *next_in + uVar6;
                *available_in = *available_in - uVar6;
                s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)uVar6;
                *next_out = *next_out + uVar6;
                *available_out = *available_out - uVar6;
              }
            }
          }
          iVar4 = EncodeData(s,0,1,&s->available_out_,&s->next_out_);
        } while (iVar4 != 0);
      }
    }
    return 0;
  }
  if (op == BROTLI_OPERATION_EMIT_METADATA) goto LAB_001068a5;
  if (s->stream_state_ - BROTLI_STREAM_METADATA_HEAD < 2) {
    return 0;
  }
  if ((s->stream_state_ != BROTLI_STREAM_PROCESSING) && (*available_in != 0)) {
    return 0;
  }
  uVar23 = (s->params).quality;
  if (1 < uVar23) {
    pMVar1 = &s->memory_manager_;
    do {
      uVar7 = s->input_pos_ - s->last_processed_pos_;
      uVar6 = 1L << ((byte)(s->params).lgblock & 0x3f);
      uVar18 = uVar6 - uVar7;
      if (uVar6 < uVar7) {
        uVar18 = 0;
      }
      uVar6 = (ulong)s->flint_;
      uVar7 = uVar6;
      if (uVar18 < uVar6) {
        uVar7 = uVar18;
      }
      if ((long)uVar6 < 0) {
        uVar7 = uVar18;
      }
      if ((uVar7 == 0) || (uVar6 = *available_in, uVar6 == 0)) {
        iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
        if (iVar4 == 0) {
          iVar4 = 3;
          if (((s->available_out_ == 0) && (op != BROTLI_OPERATION_PROCESS || uVar7 == 0)) &&
             (s->stream_state_ == BROTLI_STREAM_PROCESSING)) {
            uVar7 = *available_in;
            bVar25 = uVar7 == 0;
            bVar15 = op == BROTLI_OPERATION_FINISH && bVar25;
            bVar3 = op == BROTLI_OPERATION_FLUSH && bVar25;
            if ((op != BROTLI_OPERATION_FINISH || !bVar25) && (s->flint_ == '\0')) {
              s->flint_ = -1;
              bVar3 = true;
            }
            if ((s->params).size_hint == 0) {
              uVar6 = s->input_pos_ - s->last_processed_pos_;
              uVar18 = uVar6 + uVar7;
              if (0x3fffffff < uVar18) {
                uVar18 = 0x40000000;
              }
              if (0x3fffffff < (uVar6 | uVar7)) {
                uVar18 = 0x40000000;
              }
              (s->params).size_hint = uVar18;
            }
            iVar4 = EncodeData(s,(uint)bVar15,(uint)bVar3,&s->available_out_,&s->next_out_);
            if (iVar4 == 0) {
              iVar4 = 1;
            }
            else {
              iVar4 = 2;
              if ((bVar3 | bVar15) == 1) {
                s->stream_state_ = bVar15 + BROTLI_STREAM_FLUSH_REQUESTED;
              }
            }
          }
        }
        else {
          iVar4 = 2;
          if (s->flint_ == -1) {
            if ((s->stream_state_ == BROTLI_STREAM_FLUSH_REQUESTED) && (s->available_out_ == 0)) {
              s->stream_state_ = BROTLI_STREAM_PROCESSING;
              s->next_out_ = (uint8_t *)0x0;
            }
            if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
              s->flint_ = -2;
            }
          }
        }
      }
      else {
        if (uVar7 < uVar6) {
          uVar6 = uVar7;
        }
        puVar9 = *next_in;
        uVar23 = (uint)uVar6;
        if (((s->ringbuffer_).pos_ == 0) && (uVar6 < (s->ringbuffer_).tail_size_)) {
          (s->ringbuffer_).pos_ = uVar23;
          __dest_00 = (uint8_t *)BrotliAllocate(pMVar1,(ulong)(uVar23 + 2) + 7);
          puVar11 = (s->ringbuffer_).data_;
          if (puVar11 != (uint8_t *)0x0) {
            memcpy(__dest_00,puVar11,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
            BrotliFree(pMVar1,(s->ringbuffer_).data_);
            (s->ringbuffer_).data_ = (uint8_t *)0x0;
          }
          (s->ringbuffer_).data_ = __dest_00;
          (s->ringbuffer_).cur_size_ = uVar23;
          (s->ringbuffer_).buffer_ = __dest_00 + 2;
          __dest_00[1] = '\0';
          (s->ringbuffer_).buffer_[-2] = '\0';
          lVar10 = 0;
          do {
            (s->ringbuffer_).buffer_[lVar10 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
            lVar10 = lVar10 + 1;
          } while (lVar10 != 7);
          memcpy((s->ringbuffer_).buffer_,puVar9,uVar6);
        }
        else {
          uVar19 = (s->ringbuffer_).total_size_;
          if ((s->ringbuffer_).cur_size_ < uVar19) {
            local_68 = puVar9;
            puVar11 = (uint8_t *)BrotliAllocate(pMVar1,(ulong)(uVar19 + 2) + 7);
            puVar9 = (s->ringbuffer_).data_;
            if (puVar9 != (uint8_t *)0x0) {
              memcpy(puVar11,puVar9,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
              BrotliFree(pMVar1,(s->ringbuffer_).data_);
              (s->ringbuffer_).data_ = (uint8_t *)0x0;
            }
            (s->ringbuffer_).data_ = puVar11;
            (s->ringbuffer_).cur_size_ = uVar19;
            (s->ringbuffer_).buffer_ = puVar11 + 2;
            puVar11[1] = '\0';
            (s->ringbuffer_).buffer_[-2] = '\0';
            lVar10 = 0;
            do {
              (s->ringbuffer_).buffer_[lVar10 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
              lVar10 = lVar10 + 1;
            } while (lVar10 != 7);
            (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 2] = '\0';
            (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 1] = '\0';
            (s->ringbuffer_).buffer_[(s->ringbuffer_).size_] = 0xf1;
            puVar9 = local_68;
          }
          uVar19 = (s->ringbuffer_).tail_size_;
          uVar24 = (s->ringbuffer_).mask_ & (s->ringbuffer_).pos_;
          uVar7 = (ulong)uVar24;
          if (uVar24 < uVar19) {
            uVar18 = uVar19 - uVar7;
            if (uVar6 < uVar18) {
              uVar18 = uVar6;
            }
            memcpy((s->ringbuffer_).buffer_ + uVar7 + (s->ringbuffer_).size_,puVar9,uVar18);
          }
          if ((ulong)(s->ringbuffer_).size_ < uVar7 + uVar6) {
            uVar18 = (s->ringbuffer_).total_size_ - uVar7;
            if (uVar6 < uVar18) {
              uVar18 = uVar6;
            }
            memcpy((s->ringbuffer_).buffer_ + uVar7,puVar9,uVar18);
            puVar11 = (s->ringbuffer_).buffer_;
            lVar10 = (s->ringbuffer_).size_ - uVar7;
            puVar9 = puVar9 + lVar10;
            uVar7 = uVar6 - lVar10;
          }
          else {
            puVar11 = (s->ringbuffer_).buffer_ + uVar7;
            uVar7 = uVar6;
          }
          memcpy(puVar11,puVar9,uVar7);
          puVar9 = (s->ringbuffer_).buffer_;
          uVar19 = (s->ringbuffer_).pos_;
          puVar9[-2] = puVar9[(s->ringbuffer_).size_ - 2];
          puVar9 = (s->ringbuffer_).buffer_;
          puVar9[-1] = puVar9[(s->ringbuffer_).size_ - 1];
          (s->ringbuffer_).pos_ =
               (uVar23 & 0x7fffffff) + ((s->ringbuffer_).pos_ & 0x7fffffff) | uVar19 & 0x80000000;
        }
        s->input_pos_ = s->input_pos_ + uVar6;
        uVar23 = (s->ringbuffer_).pos_;
        if (uVar23 <= (s->ringbuffer_).mask_) {
          puVar9 = (s->ringbuffer_).buffer_;
          puVar11 = puVar9 + (ulong)uVar23 + 3;
          puVar11[0] = '\0';
          puVar11[1] = '\0';
          puVar11[2] = '\0';
          puVar11[3] = '\0';
          puVar9 = puVar9 + uVar23;
          puVar9[0] = '\0';
          puVar9[1] = '\0';
          puVar9[2] = '\0';
          puVar9[3] = '\0';
        }
        *next_in = *next_in + uVar6;
        *available_in = *available_in - uVar6;
        iVar4 = 2;
        if ('\0' < s->flint_) {
          s->flint_ = s->flint_ - (char)uVar6;
        }
      }
    } while (iVar4 == 2);
    if (iVar4 == 1) {
      return 0;
    }
    goto LAB_0010748d;
  }
  uVar18 = 1L << ((byte)(s->params).lgwin & 0x3f);
  uVar7 = *available_in;
  uVar6 = uVar18;
  if (uVar7 < uVar18) {
    uVar6 = uVar7;
  }
  sVar12 = 0x20000;
  if (uVar6 < 0x20000) {
    sVar12 = uVar6;
  }
  pMVar1 = &s->memory_manager_;
  if (uVar23 == 1) {
    if ((s->command_buf_ == (uint32_t *)0x0) && (0x1ffff < uVar6)) {
      puVar8 = (uint32_t *)BrotliAllocate(pMVar1,0x80000);
      s->command_buf_ = puVar8;
      puVar9 = (uint8_t *)BrotliAllocate(pMVar1,0x20000);
      s->literal_buf_ = puVar9;
    }
    local_a8 = s->command_buf_;
    if (local_a8 != (uint32_t *)0x0) {
      local_80 = s->literal_buf_;
      goto LAB_001071d6;
    }
    if (uVar7 == 0) {
      local_a8 = (uint32_t *)0x0;
      local_80 = (uint8_t *)0x0;
    }
    else {
      local_a8 = (uint32_t *)BrotliAllocate(pMVar1,sVar12 * 4);
      local_80 = (uint8_t *)BrotliAllocate(pMVar1,sVar12);
    }
    local_90 = local_a8;
    local_88 = local_80;
  }
  else {
    local_80 = (uint8_t *)0x0;
    local_a8 = (uint32_t *)0x0;
LAB_001071d6:
    local_88 = (uint8_t *)0x0;
    local_90 = (uint32_t *)0x0;
  }
  local_40 = s->cmd_depths_;
  local_48 = s->cmd_bits_;
  local_50 = &s->cmd_code_numbits_;
  local_58 = s->cmd_code_;
  local_60 = op - BROTLI_OPERATION_FLUSH;
  local_5c = (op == BROTLI_OPERATION_FINISH) + BROTLI_STREAM_FLUSH_REQUESTED;
LAB_0010723d:
  do {
    iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
  } while (iVar4 != 0);
  if (((s->available_out_ == 0) && (s->stream_state_ == BROTLI_STREAM_PROCESSING)) &&
     (uVar7 = *available_in, op != BROTLI_OPERATION_PROCESS || uVar7 != 0)) {
    uVar6 = uVar7;
    if (uVar7 > uVar18) {
      uVar6 = uVar18;
    }
    storage_ix = (size_t)s->last_bytes_bits_;
    BVar5 = BROTLI_STREAM_FLUSH_REQUESTED;
    if (op != BROTLI_OPERATION_FLUSH || uVar7 != 0) goto code_r0x001072cc;
    goto LAB_00107451;
  }
  BrotliFree(pMVar1,local_90);
  BrotliFree(pMVar1,local_88);
LAB_0010748d:
  if (s->stream_state_ != BROTLI_STREAM_FLUSH_REQUESTED) {
    return 1;
  }
  if (s->available_out_ != 0) {
    return 1;
  }
  s->stream_state_ = BROTLI_STREAM_PROCESSING;
  s->next_out_ = (uint8_t *)0x0;
  return 1;
code_r0x001072cc:
  local_68 = (uint8_t *)(uVar6 * 2 + 0x1f7);
  puVar9 = (uint8_t *)*available_out;
  if (puVar9 < local_68) {
    puVar11 = GetBrotliStorage(s,(size_t)local_68);
  }
  else {
    puVar11 = *next_out;
  }
  uVar23 = (uint)(op == BROTLI_OPERATION_FINISH && uVar7 <= uVar18);
  *puVar11 = (uint8_t)s->last_bytes_;
  puVar11[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  table = GetHashTable(s,(s->params).quality,uVar6,&local_38);
  if ((s->params).quality == 0) {
    BrotliCompressFragmentFast
              (pMVar1,*next_in,uVar6,uVar23,table,local_38,local_40,local_48,local_50,local_58,
               &storage_ix,puVar11);
  }
  else {
    BrotliCompressFragmentTwoPass
              (pMVar1,*next_in,uVar6,uVar23,local_a8,local_80,table,local_38,&storage_ix,puVar11);
  }
  if (uVar7 != 0) {
    *next_in = *next_in + uVar6;
    *available_in = *available_in - uVar6;
  }
  uVar6 = storage_ix >> 3;
  if (puVar9 < local_68) {
    s->next_out_ = puVar11;
    s->available_out_ = uVar6;
  }
  else {
    *next_out = *next_out + uVar6;
    *available_out = *available_out - uVar6;
    sVar12 = uVar6 + s->total_out_;
    s->total_out_ = sVar12;
    if (total_out != (size_t *)0x0) {
      *total_out = sVar12;
    }
  }
  s->last_bytes_ = (ushort)puVar11[storage_ix >> 3];
  s->last_bytes_bits_ = (byte)storage_ix & 7;
  BVar5 = local_5c;
  if (local_60 < 2 && uVar7 <= uVar18) {
LAB_00107451:
    s->stream_state_ = BVar5;
  }
  goto LAB_0010723d;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompressStream(
    BrotliEncoderState* s, BrotliEncoderOperation op, size_t* available_in,
    const uint8_t** next_in, size_t* available_out,uint8_t** next_out,
    size_t* total_out) {
  if (!EnsureInitialized(s)) return BROTLI_FALSE;

  /* Unfinished metadata block; check requirements. */
  if (s->remaining_metadata_bytes_ != BROTLI_UINT32_MAX) {
    if (*available_in != s->remaining_metadata_bytes_) return BROTLI_FALSE;
    if (op != BROTLI_OPERATION_EMIT_METADATA) return BROTLI_FALSE;
  }

  if (op == BROTLI_OPERATION_EMIT_METADATA) {
    UpdateSizeHint(s, 0);  /* First data metablock might be emitted here. */
    return ProcessMetadata(
        s, available_in, next_in, available_out, next_out, total_out);
  }

  if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD ||
      s->stream_state_ == BROTLI_STREAM_METADATA_BODY) {
    return BROTLI_FALSE;
  }

  if (s->stream_state_ != BROTLI_STREAM_PROCESSING && *available_in != 0) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return BrotliEncoderCompressStreamFast(s, op, available_in, next_in,
        available_out, next_out, total_out);
  }
  while (BROTLI_TRUE) {
    size_t remaining_block_size = RemainingInputBlockSize(s);
    /* Shorten input to flint size. */
    if (s->flint_ >= 0 && remaining_block_size > (size_t)s->flint_) {
      remaining_block_size = (size_t)s->flint_;
    }

    if (remaining_block_size != 0 && *available_in != 0) {
      size_t copy_input_size =
          BROTLI_MIN(size_t, remaining_block_size, *available_in);
      CopyInputToRingBuffer(s, copy_input_size, *next_in);
      *next_in += copy_input_size;
      *available_in -= copy_input_size;
      if (s->flint_ > 0) s->flint_ = (int8_t)(s->flint_ - (int)copy_input_size);
      continue;
    }

    if (InjectFlushOrPushOutput(s, available_out, next_out, total_out)) {
      /* Exit the "emit flint" workflow. */
      if (s->flint_ == BROTLI_FLINT_WAITING_FOR_FLUSHING) {
        CheckFlushComplete(s);
        if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
          s->flint_ = BROTLI_FLINT_DONE;
        }
      }
      continue;
    }

    /* Compress data only when internal output buffer is empty, stream is not
       finished and there is no pending flush request. */
    if (s->available_out_ == 0 &&
        s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      if (remaining_block_size == 0 || op != BROTLI_OPERATION_PROCESS) {
        BROTLI_BOOL is_last = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FINISH);
        BROTLI_BOOL force_flush = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FLUSH);
        BROTLI_BOOL result;
        /* Force emitting (uncompressed) piece containing flint. */
        if (!is_last && s->flint_ == 0) {
          s->flint_ = BROTLI_FLINT_WAITING_FOR_FLUSHING;
          force_flush = BROTLI_TRUE;
        }
        UpdateSizeHint(s, *available_in);
        result = EncodeData(s, is_last, force_flush,
            &s->available_out_, &s->next_out_);
        if (!result) return BROTLI_FALSE;
        if (force_flush) s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        if (is_last) s->stream_state_ = BROTLI_STREAM_FINISHED;
        continue;
      }
    }
    break;
  }
  CheckFlushComplete(s);
  return BROTLI_TRUE;
}